

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O3

RotationZZ<std::complex<float>_> *
qclab::qgates::operator/
          (RotationZZ<std::complex<float>_> *__return_storage_ptr__,
          RotationZZ<std::complex<float>_> *lhs,RotationZZ<std::complex<float>_> *rhs)

{
  float fVar1;
  float fVar2;
  angle_type aVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar5 = (lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems[0];
  iVar4 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar5 != iVar4) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZZ.hpp"
                  ,0xd2,
                  "RotationZZ<T> qclab::qgates::operator/(RotationZZ<T>, const RotationZZ<T> &)");
  }
  iVar5 = (*(lhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(lhs);
  iVar4 = (*(rhs->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar5 == iVar4) {
    aVar3 = (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_;
    fVar6 = aVar3.cos_;
    fVar7 = aVar3.sin_;
    fVar1 = (rhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_.cos_;
    fVar2 = (rhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_.sin_;
    aVar3.sin_ = fVar1 * fVar7 + fVar2 * -fVar6;
    aVar3.cos_ = fVar1 * fVar6 + fVar2 * fVar7;
    (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_ = aVar3;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<float>_>).super_QAdjustable.fixed_;
    aVar3 = (lhs->super_QRotationGate2<std::complex<float>_>).rotation_.angle_;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems =
         *(undefined8 *)(lhs->super_QRotationGate2<std::complex<float>_>).qubits_._M_elems;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).rotation_.angle_ = aVar3;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<float>_>).
    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004ed010;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZZ.hpp"
                ,0xc2,
                "RotationZZ<T> &qclab::qgates::RotationZZ<std::complex<float>>::operator/=(const RotationZZ<T> &) [T = std::complex<float>]"
               );
}

Assistant:

RotationZZ< T > operator/( RotationZZ< T > lhs ,
                                         const RotationZZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }